

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O2

bool aedit_uvnum(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  AREA_DATA_conflict *pAVar2;
  bool bVar3;
  bool bVar4;
  int upper_00;
  AREA_DATA_conflict *pAVar5;
  char *txt;
  char upper [4608];
  char local_1228 [4616];
  
  pAVar2 = (AREA_DATA_conflict *)ch->desc->pEdit;
  one_argument(argument,local_1228);
  bVar3 = is_number(local_1228);
  txt = "Syntax:  max_vnum [#xupper]\n\r";
  bVar4 = false;
  if ((bVar3) && (bVar4 = false, local_1228[0] != '\0')) {
    sVar1 = pAVar2->min_vnum;
    upper_00 = atoi(local_1228);
    if (upper_00 < sVar1) {
      txt = "AEdit:  Upper must be larger then lower.\n\r";
    }
    else {
      bVar4 = check_range((int)sVar1,upper_00);
      if (bVar4) {
        pAVar5 = get_vnum_area(upper_00);
        if (pAVar5 == pAVar2 || pAVar5 == (AREA_DATA_conflict *)0x0) {
          pAVar2->max_vnum = (short)upper_00;
          bVar4 = true;
          txt = "Upper vnum set.\n\r";
          goto LAB_0039f7a2;
        }
        txt = "AEdit:  Upper vnum already assigned.\n\r";
      }
      else {
        txt = "AEdit:  Range must include only this area.\n\r";
      }
    }
    bVar4 = false;
  }
LAB_0039f7a2:
  send_to_char(txt,ch);
  return bVar4;
}

Assistant:

bool aedit_uvnum(CHAR_DATA *ch, char *argument)
{
	AREA_DATA *pArea;
	char upper[MAX_STRING_LENGTH];
	int ilower;
	int iupper;

	EDIT_AREA(ch, pArea);

	one_argument(argument, upper);

	if (!is_number(upper) || upper[0] == '\0')
	{
		send_to_char("Syntax:  max_vnum [#xupper]\n\r", ch);
		return false;
	}

	if ((ilower = pArea->min_vnum) > (iupper = atoi(upper)))
	{
		send_to_char("AEdit:  Upper must be larger then lower.\n\r", ch);
		return false;
	}

	if (!check_range(ilower, iupper))
	{
		send_to_char("AEdit:  Range must include only this area.\n\r", ch);
		return false;
	}

	if (get_vnum_area(iupper) && get_vnum_area(iupper) != pArea)
	{
		send_to_char("AEdit:  Upper vnum already assigned.\n\r", ch);
		return false;
	}

	pArea->max_vnum = iupper;
	send_to_char("Upper vnum set.\n\r", ch);

	return true;
}